

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMoveCcrEa<(moira::Instr)73,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)6,_2> dst;
  Av<(moira::Instr)73,_(moira::Mode)6,_2> local_30;
  Ea<(moira::Mode)6,_2> local_2c;
  
  Op<(moira::Mode)6,2>(&local_2c,this,op & 7,addr);
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  if (SVar1 == MUSASHI) {
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,&local_2c);
    local_30.ext1 = 0;
    StrWriter::operator<<(pSVar2,&local_30);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,&local_2c);
  }
  return;
}

Assistant:

void
Moira::dasmMoveCcrEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Ccr{} << Sep{} << dst << Av<I, M, S>{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ccr{} << Sep{} << dst;
    }
}